

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcm.c
# Opt level: O0

int mbedtls_gcm_update(mbedtls_gcm_context *ctx,size_t length,uchar *input,uchar *output)

{
  uchar uVar1;
  int iVar2;
  uchar *local_78;
  size_t local_70;
  size_t olen;
  size_t use_len;
  uchar *out_p;
  uchar *p;
  size_t i;
  uchar ectr [16];
  int ret;
  uchar *output_local;
  uchar *input_local;
  size_t length_local;
  mbedtls_gcm_context *ctx_local;
  
  ectr[0xc] = 0x92;
  ectr[0xd] = 0xff;
  ectr[0xe] = 0xff;
  ectr[0xf] = 0xff;
  local_70 = 0;
  if ((input < output) && ((ulong)((long)output - (long)input) < length)) {
    ctx_local._4_4_ = -0x14;
  }
  else if ((ctx->len + length < ctx->len) || (0xfffffffe0 < ctx->len + length)) {
    ctx_local._4_4_ = -0x14;
  }
  else {
    ctx->len = length + ctx->len;
    use_len = (size_t)output;
    out_p = input;
    for (input_local = (uchar *)length; input_local != (uchar *)0x0;
        input_local = input_local + -olen) {
      if (input_local < (uchar *)0x10) {
        local_78 = input_local;
      }
      else {
        local_78 = (uchar *)0x10;
      }
      olen = (size_t)local_78;
      p = (uchar *)0x10;
      while (((uchar *)0xc < p &&
             (uVar1 = ctx->y[(long)(p + -1)] + '\x01', ctx->y[(long)(p + -1)] = uVar1, uVar1 == '\0'
             ))) {
        p = p + -1;
      }
      iVar2 = mbedtls_cipher_update(&ctx->cipher_ctx,ctx->y,0x10,(uchar *)&i,&local_70);
      ectr[0xc] = (char)iVar2;
      ectr[0xd] = (char)((uint)iVar2 >> 8);
      ectr[0xe] = (char)((uint)iVar2 >> 0x10);
      ectr[0xf] = (char)((uint)iVar2 >> 0x18);
      if (iVar2 != 0) {
        return iVar2;
      }
      for (p = (uchar *)0x0; p < olen; p = p + 1) {
        if (ctx->mode == 0) {
          ctx->buf[(long)p] = ctx->buf[(long)p] ^ out_p[(long)p];
        }
        p[use_len] = *(byte *)((long)&i + (long)p) ^ out_p[(long)p];
        if (ctx->mode == 1) {
          ctx->buf[(long)p] = ctx->buf[(long)p] ^ p[use_len];
        }
      }
      gcm_mult(ctx,ctx->buf,ctx->buf);
      out_p = out_p + olen;
      use_len = olen + use_len;
    }
    ctx_local._4_4_ = 0;
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_gcm_update( mbedtls_gcm_context *ctx,
                size_t length,
                const unsigned char *input,
                unsigned char *output )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    unsigned char ectr[16];
    size_t i;
    const unsigned char *p;
    unsigned char *out_p = output;
    size_t use_len, olen = 0;

    GCM_VALIDATE_RET( ctx != NULL );
    GCM_VALIDATE_RET( length == 0 || input != NULL );
    GCM_VALIDATE_RET( length == 0 || output != NULL );

    if( output > input && (size_t) ( output - input ) < length )
        return( MBEDTLS_ERR_GCM_BAD_INPUT );

    /* Total length is restricted to 2^39 - 256 bits, ie 2^36 - 2^5 bytes
     * Also check for possible overflow */
    if( ctx->len + length < ctx->len ||
        (uint64_t) ctx->len + length > 0xFFFFFFFE0ull )
    {
        return( MBEDTLS_ERR_GCM_BAD_INPUT );
    }

    ctx->len += length;

    p = input;
    while( length > 0 )
    {
        use_len = ( length < 16 ) ? length : 16;

        for( i = 16; i > 12; i-- )
            if( ++ctx->y[i - 1] != 0 )
                break;

        if( ( ret = mbedtls_cipher_update( &ctx->cipher_ctx, ctx->y, 16, ectr,
                                   &olen ) ) != 0 )
        {
            return( ret );
        }

        for( i = 0; i < use_len; i++ )
        {
            if( ctx->mode == MBEDTLS_GCM_DECRYPT )
                ctx->buf[i] ^= p[i];
            out_p[i] = ectr[i] ^ p[i];
            if( ctx->mode == MBEDTLS_GCM_ENCRYPT )
                ctx->buf[i] ^= out_p[i];
        }

        gcm_mult( ctx, ctx->buf, ctx->buf );

        length -= use_len;
        p += use_len;
        out_p += use_len;
    }

    return( 0 );
}